

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

optional<signed_char> ToIntegral<signed_char>(string_view str)

{
  _Optional_payload_base<signed_char> _Var1;
  char *__last;
  _Optional_payload_base<signed_char> _Var2;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<signed_char> _Var3;
  char result;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __last = str._M_str + str._M_len;
  _Var3 = std::from_chars<signed_char>(str._M_str,__last,&result,10);
  _Var2._M_payload = (_Storage<signed_char,_true>)0x0;
  _Var2._M_engaged = false;
  _Var1 = (_Optional_payload_base<signed_char>)((byte)result | 0x100);
  if (_Var3.ec != 0) {
    _Var1 = _Var2;
  }
  if (_Var3.ptr != __last) {
    _Var1._M_payload = (_Storage<signed_char,_true>)0x0;
    _Var1._M_engaged = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (_Optional_base<signed_char,_true,_true>)(_Optional_base<signed_char,_true,_true>)_Var1;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}